

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<long>::test_pow2_numerators<(libdivide::Branching)0>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)0> *the_divider)

{
  ulong uVar1;
  long lVar2;
  long numer;
  long lVar3;
  
  uVar1 = 1;
  do {
    lVar2 = -1;
    lVar3 = 1L << (uVar1 & 0x3f);
    numer = 1 - lVar3;
    do {
      test_one<(libdivide::Branching)0>(this,lVar3 + lVar2,denom,the_divider);
      test_one<(libdivide::Branching)0>(this,numer,denom,the_divider);
      lVar2 = lVar2 + 1;
      numer = numer + -1;
    } while (lVar2 != 2);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x3f);
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }